

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidDelegate.cpp
# Opt level: O0

void __thiscall MeshLib::SolidDelegate::removeHalfedge(SolidDelegate *this,Solid *pS,HalfEdge *he)

{
  Edge *this_00;
  HalfEdge *pHVar1;
  Edge **ppEVar2;
  HalfEdge **ppHVar3;
  TopologyException *this_01;
  Face **ppFVar4;
  Trait **ppTVar5;
  Edge *edge;
  HalfEdge *he_local;
  Solid *pS_local;
  SolidDelegate *this_local;
  
  ppEVar2 = HalfEdge::edge(he);
  this_00 = *ppEVar2;
  ppHVar3 = Edge::halfedge(this_00,0);
  if (*ppHVar3 == he) {
    ppHVar3 = Edge::halfedge(this_00,1);
    pHVar1 = *ppHVar3;
    ppHVar3 = Edge::halfedge(this_00,0);
    *ppHVar3 = pHVar1;
    ppHVar3 = Edge::halfedge(this_00,1);
    *ppHVar3 = (HalfEdge *)0x0;
  }
  else {
    ppHVar3 = Edge::halfedge(this_00,1);
    if (*ppHVar3 != he) {
      this_01 = (TopologyException *)__cxa_allocate_exception(8);
      TopologyException::TopologyException(this_01,"SolidDelegate");
      __cxa_throw(this_01,&TopologyException::typeinfo,TopologyException::~TopologyException);
    }
    ppHVar3 = Edge::halfedge(this_00,1);
    *ppHVar3 = (HalfEdge *)0x0;
  }
  ppFVar4 = HalfEdge::face(he);
  ppHVar3 = Face::halfedge(*ppFVar4);
  if (*ppHVar3 == he) {
    ppFVar4 = HalfEdge::face(he);
    ppHVar3 = Face::halfedge(*ppFVar4);
    *ppHVar3 = (HalfEdge *)0x0;
  }
  ppTVar5 = HalfEdge::trait(he);
  if (*ppTVar5 != (Trait *)0x0) {
    ppTVar5 = HalfEdge::trait(he);
    Trait::clear(ppTVar5);
  }
  ppHVar3 = Edge::halfedge(this_00,0);
  if ((*ppHVar3 == (HalfEdge *)0x0) &&
     (ppHVar3 = Edge::halfedge(this_00,1), *ppHVar3 == (HalfEdge *)0x0)) {
    ppTVar5 = Edge::trait(this_00);
    if (*ppTVar5 != (Trait *)0x0) {
      ppTVar5 = Edge::trait(this_00);
      Trait::clear(ppTVar5);
    }
    AVL::Tree<MeshLib::Edge>::remove(&pS->m_edges,(char *)this_00);
    if (this_00 != (Edge *)0x0) {
      Edge::~Edge(this_00);
      operator_delete(this_00);
    }
  }
  if (he != (HalfEdge *)0x0) {
    HalfEdge::~HalfEdge(he);
    operator_delete(he);
  }
  return;
}

Assistant:

void SolidDelegate::removeHalfedge(Solid *pS,  HalfEdge * he )
{
	//he->edge
	Edge * edge = he->edge();

	if( edge->halfedge(0) == he )
	{
		edge->halfedge(0) = edge->halfedge(1);
		edge->halfedge(1) = NULL;
	}
	else
	{
		if( edge->halfedge(1) != he ) throw TopologyException("SolidDelegate");
		edge->halfedge(1) = NULL;
	}

	
	//he->face
	if( he->face()->halfedge() == he )
	{
		he->face()->halfedge() = NULL;
	}

	if( he->trait() != NULL )
	{
		Trait::clear(  he->trait() );
	}
	//
	if( edge->halfedge(0) == NULL && edge->halfedge(1) == NULL )
	{
		if( edge->trait() != NULL )
		{
			Trait::clear( edge->trait() );
		}
		pS->m_edges.remove( edge );
		delete edge;
		edge = NULL;
	}
	delete he;
}